

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

CTPNCodeBody * __thiscall
CTcParser::parse_code_body
          (CTcParser *this,int eq_before_brace,int is_obj_prop,int self_valid,int *p_argc,
          int *p_opt_argc,int *p_varargs,int *p_varargs_list,CTcSymLocal **p_varargs_list_local,
          int *p_has_retval,int *err,CTcPrsSymtab *param_11,tcprs_codebodytype cb_type,
          propset_def *propset_stack,int propset_depth,CTcCodeBodyRef *enclosing_code_body,
          CTcFormalTypeList **type_list)

{
  CTcTokFileDesc *pCVar1;
  bool bVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  tc_toktyp_t tVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  CTcCodeBodyRef *pCVar11;
  CTcSymLocal *lcl;
  CTcPrsNode *pCVar12;
  CTcPrsNode *pCVar13;
  CTPNStmExpr *this_00;
  CTPNStmBase *this_01;
  CTPNCodeBody *this_02;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CTcPrsSymtab *pCVar14;
  CTcPrsSymtab *pCVar15;
  int *err_00;
  ulong uVar16;
  CTcSymLocal *siz;
  size_t sVar17;
  CTcParser *this_03;
  CTcPrsNode *pCVar18;
  long lVar19;
  int self_valid_00;
  int varargs_list;
  int varargs;
  int opt_formal_num;
  int formal_num;
  CTcTokFileDesc *local_60;
  CTcSymLocal *varargs_list_local;
  int *local_50;
  int *local_48;
  int *local_40;
  ulong local_38;
  
  uVar16 = (ulong)(uint)self_valid;
  local_60 = (CTcTokFileDesc *)CONCAT44(local_60._4_4_,is_obj_prop);
  this_03 = (CTcParser *)G_prsmem;
  local_48 = p_argc;
  local_40 = p_opt_argc;
  pCVar11 = (CTcCodeBodyRef *)CTcPrsMem::alloc(G_prsmem,8);
  pCVar11->ptr = (CTPNCodeBody *)0x0;
  this->cur_code_body_ = pCVar11;
  this->self_valid_ = self_valid;
  this->field_0x1e8 = this->field_0x1e8 & 0xfe;
  this->local_ctx_var_num_ = 0;
  this->ctx_var_props_used_ = 0;
  this->next_ctx_arr_idx_ = 2;
  this->self_referenced_ = 0;
  this->full_method_ctx_referenced_ = 0;
  this->local_ctx_needs_self_ = 0;
  this->local_ctx_needs_full_method_ctx_ = 0;
  pCVar14 = param_11;
  if (param_11 == (CTcPrsSymtab *)0x0) {
    pCVar14 = this->global_symtab_;
  }
  this->local_symtab_ = pCVar14;
  pCVar15 = pCVar14->parent_;
  if (pCVar14->parent_ == (CTcPrsSymtab *)0x0) {
    pCVar15 = this->global_symtab_;
  }
  this->enclosing_local_symtab_ = pCVar15;
  this->goto_symtab_ = (CTcPrsSymtab *)0x0;
  this->local_cnt_ = 0;
  this->max_local_cnt_ = 0;
  this->enclosing_stm_ = (CTPNStmEnclosing *)0x0;
  formal_num = 0;
  opt_formal_num = 0;
  varargs = 0;
  varargs_list = 0;
  varargs_list_local = (CTcSymLocal *)0x0;
  local_38 = uVar16;
  if (cb_type == TCPRS_CB_SHORT_ANON_FN) {
    pCVar1 = G_tok->last_desc_;
    lVar19 = G_tok->last_linenum_;
    siz = (CTcSymLocal *)0x0;
    parse_formal_list(this,0,1,&formal_num,&opt_formal_num,&varargs,&varargs_list,
                      &varargs_list_local,err,0,1,(CTcFormalTypeList **)0x0);
    if (*err != 0) {
      return (CTPNCodeBody *)0x0;
    }
    local_50 = &this->local_cnt_;
    pCVar18 = (CTcPrsNode *)0x0;
    local_60 = pCVar1;
    while (tVar7 = (G_tok->curtok_).typ_, tVar7 == TOKT_LOCAL) {
      tVar7 = CTcTokenizer::next(G_tok);
      if (tVar7 == TOKT_SYM) {
        uVar9 = this->local_cnt_;
        siz = (CTcSymLocal *)(ulong)uVar9;
        if (this->max_local_cnt_ <= (int)uVar9) {
          this->max_local_cnt_ = uVar9 + 1;
        }
        pCVar14 = this->local_symtab_;
        *local_50 = uVar9 + 1;
        lcl = CTcPrsSymtab::add_local(pCVar14,uVar9);
        tVar7 = CTcTokenizer::next(G_tok);
        if (((tVar7 == TOKT_ASI) || (pCVar12 = pCVar18, (G_tok->curtok_).typ_ == TOKT_EQ)) &&
           (pCVar12 = parse_local_initializer(this,lcl,err_00), siz = lcl,
           pCVar18 != (CTcPrsNode *)0x0)) {
          pCVar13 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x18,(size_t)lcl);
          pCVar13[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar18;
          pCVar13[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar12;
          (pCVar13->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
               (_func_int **)&PTR_gen_code_0030f3e0;
          siz = lcl;
          pCVar12 = pCVar13;
        }
        pCVar18 = pCVar12;
        if ((G_tok->curtok_).typ_ == TOKT_COMMA) {
          CTcTokenizer::next(G_tok);
        }
      }
      else {
        siz = (CTcSymLocal *)0x2b29;
        CTcTokenizer::log_error_curtok(G_tok,0x2b29);
      }
    }
    pCVar12 = pCVar18;
    if (pCVar18 == (CTcPrsNode *)0x0 || tVar7 != TOKT_RBRACE) {
      siz = (CTcSymLocal *)0x1;
      pCVar12 = parse_expr_or_dstr(this,1);
      if (pCVar18 != (CTcPrsNode *)0x0) {
        pCVar13 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x18,(size_t)siz);
        pCVar13[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar18;
        pCVar13[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar12;
        (pCVar13->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_0030f3e0;
        pCVar12 = pCVar13;
      }
    }
    tVar7 = (G_tok->curtok_).typ_;
    if (tVar7 == TOKT_SEM) {
      CTcTokenizer::log_error(0x2ba1);
      CTcTokenizer::next(G_tok);
      tVar7 = (G_tok->curtok_).typ_;
    }
    if (tVar7 == TOKT_EOF) {
      CTcTokenizer::log_error_curtok(G_tok,0x2ba2);
      *err = 1;
      return (CTPNCodeBody *)0x0;
    }
    if (tVar7 == TOKT_RBRACE) {
      CTcTokenizer::next(G_tok);
    }
    else {
      siz = (CTcSymLocal *)0x2ba2;
      CTcTokenizer::log_error_curtok(G_tok,0x2ba2);
    }
    iVar8 = (*(pCVar12->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[10])(pCVar12);
    this_00 = (CTPNStmExpr *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x28,(size_t)siz);
    if (iVar8 == 0) {
      CTPNStmExpr::CTPNStmExpr(this_00,pCVar12);
    }
    else {
      CTPNStmReturn::CTPNStmReturn((CTPNStmReturn *)this_00,pCVar12);
    }
    this_01 = (CTPNStmBase *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x48,(size_t)pCVar12);
    CTPNStmComp::CTPNStmComp((CTPNStmComp *)this_01,(CTPNStm *)this_00,this->local_symtab_);
    goto LAB_002022dd;
  }
  if (propset_depth != 0) {
    insert_propset_expansion(this_03,propset_stack,propset_depth);
  }
  tVar7 = (G_tok->curtok_).typ_;
  if (tVar7 == TOKT_LPAR) {
    CTcTokenizer::next(G_tok);
    parse_formal_list(this,0,1,&formal_num,&opt_formal_num,&varargs,&varargs_list,
                      &varargs_list_local,err,0,0,type_list);
    if (*err != 0) {
      return (CTPNCodeBody *)0x0;
    }
    tVar7 = (G_tok->curtok_).typ_;
  }
  if (tVar7 == TOKT_EQ) {
    if (eq_before_brace == 0) {
      if ((int)local_60 == 0) goto LAB_00202140;
      CTcTokenizer::log_error(0x2b20);
    }
    CTcTokenizer::next(G_tok);
  }
LAB_00202140:
  tVar7 = (G_tok->curtok_).typ_;
  if ((tVar7 == TOKT_SEM) || (tVar7 == TOKT_RBRACE)) {
    sVar17 = 0x2b21;
    CTcTokenizer::log_error_curtok(G_tok,0x2b21);
    this_01 = (CTPNStmBase *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x48,sVar17);
    lVar19 = 0;
    CTPNStmComp::CTPNStmComp((CTPNStmComp *)this_01,(CTPNStm *)0x0,(CTcPrsSymtab *)0x0);
    local_60 = (CTcTokFileDesc *)0x0;
  }
  else {
    if (tVar7 != TOKT_LBRACE) {
      CTcTokenizer::log_error_curtok(G_tok,0x2b21);
    }
    local_60 = G_tok->last_desc_;
    lVar19 = G_tok->last_linenum_;
    this_01 = (CTPNStmBase *)parse_compound(this,err,1,1,(CTPNStmSwitch *)0x0,1);
  }
LAB_002022dd:
  this_02 = (CTPNCodeBody *)0x0;
  if ((this_01 != (CTPNStmBase *)0x0) && (*err == 0)) {
    sVar17 = 1;
    uVar9 = (*(this_01->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0x1c])(this_01);
    if (((G_prs->field_0xec & 4) == 0) &&
       ((sVar17 = 0x2b2f, (~uVar9 & 0xc) == 0 || (sVar17 = 0x2b30, (~uVar9 & 9) == 0)))) {
      CTPNStmBase::log_warning(this_01,(int)sVar17);
    }
    if (local_48 != (int *)0x0) {
      *local_48 = formal_num;
    }
    if (local_40 != (int *)0x0) {
      *local_40 = opt_formal_num;
    }
    if (p_varargs != (int *)0x0) {
      *p_varargs = varargs;
    }
    if (p_varargs_list != (int *)0x0) {
      *p_varargs_list = varargs_list;
    }
    if (p_varargs_list_local != (CTcSymLocal **)0x0) {
      *p_varargs_list_local = varargs_list_local;
    }
    if (p_has_retval != (int *)0x0) {
      *p_has_retval = uVar9 >> 3 & 1;
    }
    this_02 = (CTPNCodeBody *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0xd8,sVar17);
    self_valid_00 = (int)local_38;
    CTPNCodeBody::CTPNCodeBody
              (this_02,this->local_symtab_,this->goto_symtab_,(CTPNStm *)this_01,formal_num,
               opt_formal_num,varargs,varargs_list,varargs_list_local,this->max_local_cnt_,
               self_valid_00,enclosing_code_body);
    this->cur_code_body_->ptr = this_02;
    (this_02->super_CTPNCodeBodyBase).start_desc_ = local_60;
    (this_02->super_CTPNCodeBodyBase).start_linenum_ = lVar19;
    iVar8 = (*(this_01->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0x1a])(this_01);
    iVar10 = (*(this_01->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0x1b])(this_01)
    ;
    (this_02->super_CTPNCodeBodyBase).end_desc_ = (CTcTokFileDesc *)CONCAT44(extraout_var,iVar8);
    (this_02->super_CTPNCodeBodyBase).end_linenum_ = CONCAT44(extraout_var_00,iVar10);
    finish_local_ctx(this,this_02,param_11);
    uVar9 = this->self_referenced_;
    if (((cb_type - TCPRS_CB_ANON_FN & 0xfffffffd) == 0 && self_valid_00 != 0) &&
       (bVar2 = uVar9 != 0, uVar9 = 0, bVar2 || this->full_method_ctx_referenced_ != 0)) {
      CTPNCodeBodyBase::get_or_add_ctx_var_for_level((CTPNCodeBodyBase *)this_02,1);
      uVar9 = this->self_referenced_;
    }
    uVar5 = (ushort)*(undefined4 *)&(this_02->super_CTPNCodeBodyBase).field_0xb8;
    uVar3 = (ushort)((uVar9 & 1) << 7);
    *(ushort *)&(this_02->super_CTPNCodeBodyBase).field_0xb8 = uVar5 & 0xff7f | uVar3;
    uVar6 = (ushort)((this->full_method_ctx_referenced_ & 1U) << 8);
    *(ushort *)&(this_02->super_CTPNCodeBodyBase).field_0xb8 = uVar5 & 0xfe7f | uVar3 | uVar6;
    uVar4 = (ushort)((this->local_ctx_needs_self_ & 1U) << 4);
    *(ushort *)&(this_02->super_CTPNCodeBodyBase).field_0xb8 =
         uVar5 & 0xfe6f | uVar3 | uVar6 | uVar4;
    *(ushort *)&(this_02->super_CTPNCodeBodyBase).field_0xb8 =
         uVar5 & 0xfe4f | uVar3 | uVar6 | uVar4 |
         (ushort)((this->local_ctx_needs_full_method_ctx_ & 1U) << 5);
  }
  return this_02;
}

Assistant:

CTPNCodeBody *CTcParser::parse_code_body(
    int eq_before_brace, int is_obj_prop, int self_valid,
    int *p_argc, int *p_opt_argc, int *p_varargs, int *p_varargs_list,
    CTcSymLocal **p_varargs_list_local, int *p_has_retval,
    int *err, CTcPrsSymtab *local_symtab, tcprs_codebodytype cb_type,
    struct propset_def *propset_stack, int propset_depth,
    CTcCodeBodyRef *enclosing_code_body, CTcFormalTypeList **type_list)
{
    /* 
     *   create a new code body reference - this will let nested code bodies
     *   refer back to the code body object we're about to parse, even though
     *   we won't create the actual code body object until we're done parsing
     *   the entire code body 
     */
    cur_code_body_ = new (G_prsmem) CTcCodeBodyRef();

    /* note if we're parsing some kind of anonymous function */
    int parsing_anon_fn = (cb_type == TCPRS_CB_ANON_FN
                           || cb_type == TCPRS_CB_SHORT_ANON_FN);

    /* remember the 'self' validity */
    self_valid_ = self_valid;

    /* presume we will not need a local variable context object */
    clear_local_ctx();

    /* 
     *   Set the outer local symbol table.  If the caller has provided us
     *   with an explicit pre-constructed local symbol table, use that;
     *   otherwise, use the global symbol table, since we have no locals
     *   of our own yet.  
     */
    local_symtab_ = (local_symtab == 0 ? global_symtab_ : local_symtab);
    enclosing_local_symtab_ = (local_symtab_->get_parent() == 0
                               ? global_symtab_
                               : local_symtab_->get_parent());

    /* there's no enclosing statement yet */
    enclosing_stm_ = 0;

    /* 
     *   defer creating a 'goto' symbol table until we encounter a label
     *   or a 'goto' 
     */
    goto_symtab_ = 0;

    /* no locals yet */
    local_cnt_ = 0;
    max_local_cnt_ = 0;

    /* no formals yet */
    int formal_num = 0;
    int opt_formal_num = 0;
    int varargs = FALSE;
    int varargs_list = FALSE;
    CTcSymLocal *varargs_list_local = 0;

    /* we haven't built our statement yet */
    CTPNStmComp *stm = 0;
    long start_line = 0;
    CTcTokFileDesc *start_desc = 0;

    /* check for a short anonymous function, which uses unusual syntax */
    if (cb_type == TCPRS_CB_SHORT_ANON_FN)
    {
        /* we're at the opening brace now */
        G_tok->get_last_pos(&start_desc, &start_line);
        
        /* 
         *   a short-form anonymous function always has an argument list,
         *   but it uses special notation: the argument list is simply the
         *   first thing after the function's open brace, and ends with a
         *   colon 
         */
        parse_formal_list(FALSE, TRUE, &formal_num, &opt_formal_num,
                          &varargs, &varargs_list, &varargs_list_local,
                          err, 0, TRUE, 0);
        if (*err)
            return 0;

        /*
         *   The contents of a short-form anonymous function are simply an
         *   expression, whose value is implicitly returned by the function.
         *   Alternatively, it can start with a list of "local" clauses, to
         *   define local variables.  
         */
        CTcPrsNode *expr = 0;
        while (G_tok->cur() == TOKT_LOCAL)
        {
            /* we need a variable name symbol */
            if (G_tok->next() == TOKT_SYM)
            {
                /* add the symbol */
                CTcSymLocal *lcl = local_symtab_->add_local(alloc_local());

                /* check for an initializer */
                CTcPrsNode *subexpr = 0;
                if (G_tok->next() == TOKT_ASI || G_tok->cur() == TOKT_EQ)
                {
                    /* parse the initializer */
                    subexpr = parse_local_initializer(lcl, err);

                    /* combine it with the expression we had so far */
                    expr = (expr == 0 ? subexpr :
                            new CTPNComma(expr, subexpr));
                }

                /* if there's a comma, skip it */
                if (G_tok->cur() == TOKT_COMMA)
                    G_tok->next();
            }
            else
            {
                /* invalid 'local' syntax */
                G_tok->log_error_curtok(TCERR_LOCAL_REQ_SYM);
            }
        }

        /* if there's anything left, parse the simple expression */
        if (expr == 0 || G_tok->cur() != TOKT_RBRACE)
        {
            /* parse the rest of the expression */
            CTcPrsNode *subexpr = parse_expr_or_dstr(TRUE);

            /* combine it with the local initializers, if any */
            expr = (expr == 0 ? subexpr : new CTPNComma(expr, subexpr));
        }

        /*
         *   The next token must be the closing brace ('}') of the function.
         *   If the next token is a semicolon, it's an error, but it's
         *   probably just a superfluous semicolon that we can ignore.  
         */
        if (G_tok->cur() == TOKT_SEM)
        {
            /* log an error explaining the problem */
            G_tok->log_error(TCERR_SEM_IN_SHORT_ANON_FN);

            /* skip the semicolon */
            G_tok->next();
        }

        /* check for the brace */
        switch (G_tok->cur())
        {
        case TOKT_RBRACE:
            /* this is what we want - skip it and continue */
            G_tok->next();
            break;

        case TOKT_EOF:
            /* log an error and give up */
            G_tok->log_error_curtok(TCERR_SHORT_ANON_FN_REQ_RBRACE);
            *err = 1;
            return 0;

        default:
            /* log an error, assuming they simply forgot the '}' */
            G_tok->log_error_curtok(TCERR_SHORT_ANON_FN_REQ_RBRACE);
            break;
        }

        /* 
         *   This anonymous function syntax implicitly returns the value of
         *   the expression, so generate a 'return' statement node that
         *   returns the expression.  If the expression has no return value,
         *   we're simply evaluating it for side-effects, so wrap it in a
         *   simple 'expression' statement.  
         */
        CTPNStm *ret_stm;
        if (expr->has_return_value())
            ret_stm = new CTPNStmReturn(expr);
        else
            ret_stm = new CTPNStmExpr(expr);

        /* put the 'return' statement inside a compound statement */
        stm = new CTPNStmComp(ret_stm, local_symtab_);
    }
    else
    {
        /*
         *   If we have a propertyset stack, set up an inserted token stream
         *   with the expanded token list for the formals, combining the
         *   formals from the enclosing propertyset definitions with the
         *   formals defined here.  
         */
        if (propset_depth != 0)
            insert_propset_expansion(propset_stack, propset_depth);

        /* 
         *   if we have an explicit left parenthesis, or an implied formal
         *   list from an enclosing propertyset, parse the list 
         */
        if (G_tok->cur() == TOKT_LPAR)
        {
            /* skip the open paren */
            G_tok->next();
            
            /* 
             *   Parse the formal list.  Add the symbols to the local
             *   table (hence 'count_only' = false), and don't allow
             *   optional arguments.  
             */
            parse_formal_list(FALSE, TRUE, &formal_num, &opt_formal_num,
                              &varargs, &varargs_list, &varargs_list_local,
                              err, 0, FALSE, type_list);
            if (*err)
                return 0;
        }

        /* parse an equals sign, if present */
        if (G_tok->cur() == TOKT_EQ)
        {
            /*
             *   An equals sign after a formal parameter list can be used if
             *   the 'eq_before_brace' flag is set.  Otherwise, if we're
             *   defining an object property, this is an error, since it's
             *   obsolete TADS 2 syntax that we no longer allow - because
             *   this is a change in syntax, we want to catch it
             *   specifically so we can provide good diagnostic information
             *   for it.  
             */
            if (eq_before_brace && G_tok->cur() == TOKT_EQ)
            {
                /* it's allowed - skip the '=' */
                G_tok->next();
            }
            else if (is_obj_prop)
            {
                /* obsolete tads 2 syntax - flag the error */
                G_tok->log_error(TCERR_EQ_WITH_METHOD_OBSOLETE);

                /* 
                 *   skip the '=' so we can continue parsing the rest of the
                 *   code body without cascading errors 
                 */
                G_tok->next();
            }
            else
            {
                /* 
                 *   it's not a situation where we allow '=' specifically,
                 *   or where we know why it might be present erroneously -
                 *   let it go for now, as we'll flag the error in the
                 *   normal compound statement parsing 
                 */
            }
        }

        /* check for '(' syntax */
        //$$$

        /* require the '{' */
        switch (G_tok->cur())
        {
        case TOKT_LBRACE:
        parse_body:
            /* note the location of the opening brace */
            G_tok->get_last_pos(&start_desc, &start_line);

            /* parse the compound statement */
            stm = parse_compound(err, TRUE, TRUE, 0, TRUE);
            break;

        case TOKT_SEM:
        case TOKT_RBRACE:
            /* 
             *   we seem to have found the end of the object definition, or
             *   the end of a code body - treat it as an empty code body 
             */
            G_tok->log_error_curtok(TCERR_REQ_LBRACE_CODE);
            stm = new CTPNStmComp(0, 0);
            break;

        default:
            /* 
             *   the '{' was missing - log an error, but proceed from the
             *   current token on the assumption that they merely left out
             *   the open brace 
             */
            G_tok->log_error_curtok(TCERR_REQ_LBRACE_CODE);
            goto parse_body;
        }
    }

    /* if that failed, return the error */
    if (*err || stm == 0)
        return 0;

    /* 
     *   determine how the statement exits, and generate any internal flow
     *   warnings within the body code
     */
    unsigned long flow_flags = stm->get_control_flow(TRUE);

    /*
     *   Warn if the function has both explicit void and value returns.
     *   If not, check to see if it continues; if so, it implicitly
     *   returns a void value by falling off the end, so warn if it both
     *   falls off the end and returns a value somewhere else.  Suppress
     *   this warning if this is a syntax check only.  
     */
    if (!G_prs->get_syntax_only())
    {
        if ((flow_flags & TCPRS_FLOW_RET_VAL) != 0
            && (flow_flags & TCPRS_FLOW_RET_VOID) != 0)
        {
            /* it has explicit void and value returns */
            stm->log_warning(TCERR_RET_VAL_AND_VOID);
        }
        else if ((flow_flags & TCPRS_FLOW_RET_VAL) != 0
                 && (flow_flags & TCPRS_FLOW_NEXT) != 0)
        {
            /* it has explicit value returns, and implicit void return */
            stm->log_warning(TCERR_RET_VAL_AND_IMP_VOID);
        }
    }
        
    /* if the caller is interested, return the interface details */
    if (p_argc != 0)
        *p_argc = formal_num;
    if (p_opt_argc != 0)
        *p_opt_argc = opt_formal_num;
    if (p_varargs != 0)
        *p_varargs = varargs;
    if (p_varargs_list != 0)
        *p_varargs_list = varargs_list;
    if (p_varargs_list_local != 0)
        *p_varargs_list_local = varargs_list_local;
    if (p_has_retval)
        *p_has_retval = ((flow_flags & TCPRS_FLOW_RET_VAL) != 0);

    /* create a code body node for the result */
    CTPNCodeBody *body_stm = new CTPNCodeBody(
        local_symtab_, goto_symtab_, stm,
        formal_num, opt_formal_num, varargs, varargs_list, varargs_list_local,
        max_local_cnt_, self_valid, enclosing_code_body);

    /* store this new statement in the current code body reference object */
    cur_code_body_->ptr = body_stm;

    /* save the starting location */
    body_stm->set_start_location(start_desc, start_line);

    /* 
     *   set the end location in the new code body to the end location in
     *   the underlying compound statement 
     */
    body_stm->set_end_location(stm->get_end_desc(), stm->get_end_linenum());

    /* set up the local context for access to enclosing scope locals */
    finish_local_ctx(body_stm, local_symtab);

    /* 
     *   if 'self' is valid, and we're parsing an anonymous function, and we
     *   have any references in this code body to any method context
     *   variables (self, targetprop, targetobj, definingobj), make certain
     *   that the code body has a context at level 1, so that it can pick up
     *   our method context 
     */
    if (self_valid && parsing_anon_fn
        && (self_referenced_ || full_method_ctx_referenced_))
        body_stm->get_or_add_ctx_var_for_level(1);

    /* mark the code body for references to the method context */
    body_stm->set_self_referenced(self_referenced_);
    body_stm->set_full_method_ctx_referenced(full_method_ctx_referenced_);

    /* 
     *   mark the code body for inclusion in any local context of the method
     *   context 
     */
    body_stm->set_local_ctx_needs_self(local_ctx_needs_self_);
    body_stm->set_local_ctx_needs_full_method_ctx(
        local_ctx_needs_full_method_ctx_);

    /* return the new body statement */
    return body_stm;
}